

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdata.cpp
# Opt level: O0

void __thiscall
icu_63::CollationData::makeReorderRanges
          (CollationData *this,int32_t *reorder,int32_t length,UBool latinMustMove,UVector32 *ranges
          ,UErrorCode *errorCode)

{
  bool bVar1;
  UBool UVar2;
  int iVar3;
  int32_t iVar4;
  int iVar5;
  int local_194;
  int32_t newLeadByte;
  int32_t nextOffset;
  int32_t i_4;
  int32_t offset;
  int32_t start_1;
  int32_t leadByte;
  int32_t i_3;
  int32_t index_3;
  int32_t index_4;
  int32_t script;
  int32_t i_2;
  UBool hasReorderToEnd;
  int32_t originalLength;
  int32_t start;
  int32_t index_2;
  int32_t skippedReserved;
  int32_t index_1;
  int32_t i_1;
  int32_t reorderCode;
  int32_t i;
  uint32_t specials;
  int32_t highLimit;
  int32_t lowStart;
  int32_t index;
  uint8_t table [256];
  UErrorCode *errorCode_local;
  UVector32 *ranges_local;
  UBool latinMustMove_local;
  int32_t length_local;
  int32_t *reorder_local;
  CollationData *this_local;
  
  UVar2 = ::U_FAILURE(*errorCode);
  if (UVar2 != '\0') {
    return;
  }
  UVector32::removeAllElements(ranges);
  if (length == 0) {
    return;
  }
  if ((length == 1) && (*reorder == 0x67)) {
    return;
  }
  memset(&lowStart,0,0x100);
  if (this->scriptsIndex[this->numScripts + 0xe] != 0) {
    *(undefined1 *)((long)&lowStart + (long)(int)(uint)this->scriptsIndex[this->numScripts + 0xe]) =
         0xff;
  }
  if (this->scriptsIndex[this->numScripts + 0xf] != 0) {
    *(undefined1 *)((long)&lowStart + (long)(int)(uint)this->scriptsIndex[this->numScripts + 0xf]) =
         0xff;
  }
  specials = (uint32_t)this->scriptStarts[1];
  i = (int32_t)this->scriptStarts[this->scriptStartsLength + -1];
  reorderCode = 0;
  for (i_1 = 0; i_1 < length; i_1 = i_1 + 1) {
    iVar3 = reorder[i_1] + -0x1000;
    if ((-1 < iVar3) && (iVar3 < 8)) {
      reorderCode = 1 << ((byte)iVar3 & 0x1f) | reorderCode;
    }
  }
  for (skippedReserved = 0; skippedReserved < 8; skippedReserved = skippedReserved + 1) {
    if ((this->scriptsIndex[this->numScripts + skippedReserved] != 0) &&
       ((reorderCode & 1 << ((byte)skippedReserved & 0x1f)) == 0)) {
      specials = addLowScriptRange(this,(uint8_t *)&lowStart,
                                   (uint)this->scriptsIndex[this->numScripts + skippedReserved],
                                   specials);
    }
  }
  start = 0;
  if (((reorderCode == 0) && (*reorder == 0x19)) && (latinMustMove == '\0')) {
    start = this->scriptStarts[(int)(uint)this->scriptsIndex[0x19]] - specials;
    specials = (uint)this->scriptStarts[(int)(uint)this->scriptsIndex[0x19]];
  }
  bVar1 = false;
  index_4 = 0;
LAB_00291ee5:
  if (index_4 < length) {
    iVar5 = index_4 + 1;
    iVar3 = reorder[index_4];
    if (iVar3 != 0x67) {
      if (iVar3 == -1) {
        *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return;
      }
      iVar4 = getScriptIndex(this,iVar3);
      index_4 = iVar5;
      if (iVar4 != 0) {
        if (*(char *)((long)&lowStart + (long)iVar4) != '\0') {
          *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
          return;
        }
        specials = addLowScriptRange(this,(uint8_t *)&lowStart,iVar4,specials);
      }
      goto LAB_00291ee5;
    }
    bVar1 = true;
    ranges_local._4_4_ = length;
    while (iVar5 < ranges_local._4_4_) {
      ranges_local._4_4_ = ranges_local._4_4_ + -1;
      iVar3 = reorder[ranges_local._4_4_];
      if ((iVar3 == 0x67) || (iVar3 == -1)) {
        *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return;
      }
      iVar4 = getScriptIndex(this,iVar3);
      if (iVar4 != 0) {
        if (*(char *)((long)&lowStart + (long)iVar4) != '\0') {
          *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
          return;
        }
        i = addHighScriptRange(this,(uint8_t *)&lowStart,iVar4,i);
      }
    }
  }
  for (start_1 = 1; start_1 < this->scriptStartsLength + -1; start_1 = start_1 + 1) {
    if (*(char *)((long)&lowStart + (long)start_1) == '\0') {
      if ((!bVar1) && ((int)specials < (int)(uint)this->scriptStarts[start_1])) {
        specials = (uint)this->scriptStarts[start_1];
      }
      specials = addLowScriptRange(this,(uint8_t *)&lowStart,start_1,specials);
    }
  }
  if (i < (int)specials) {
    if (i < (int)(specials - (start & 0xff00U))) {
      *errorCode = U_BUFFER_OVERFLOW_ERROR;
    }
    else {
      makeReorderRanges(this,reorder,length,'\x01',ranges,errorCode);
    }
  }
  else {
    nextOffset = 0;
    newLeadByte = 1;
    while( true ) {
      local_194 = nextOffset;
      while ((newLeadByte < this->scriptStartsLength + -1 &&
             ((*(byte *)((long)&lowStart + (long)newLeadByte) == 0xff ||
              (local_194 = (uint)*(byte *)((long)&lowStart + (long)newLeadByte) -
                           ((int)(uint)this->scriptStarts[newLeadByte] >> 8),
              local_194 == nextOffset))))) {
        newLeadByte = newLeadByte + 1;
      }
      if ((nextOffset != 0) || (newLeadByte < this->scriptStartsLength + -1)) {
        UVector32::addElement
                  (ranges,(uint)this->scriptStarts[newLeadByte] << 0x10 | nextOffset & 0xffffU,
                   errorCode);
      }
      if (newLeadByte == this->scriptStartsLength + -1) break;
      nextOffset = local_194;
      newLeadByte = newLeadByte + 1;
    }
  }
  return;
}

Assistant:

void
CollationData::makeReorderRanges(const int32_t *reorder, int32_t length,
                                 UBool latinMustMove,
                                 UVector32 &ranges, UErrorCode &errorCode) const {
    if(U_FAILURE(errorCode)) { return; }
    ranges.removeAllElements();
    if(length == 0 || (length == 1 && reorder[0] == USCRIPT_UNKNOWN)) {
        return;
    }

    // Maps each script-or-group range to a new lead byte.
    uint8_t table[MAX_NUM_SCRIPT_RANGES];
    uprv_memset(table, 0, sizeof(table));

    {
        // Set "don't care" values for reserved ranges.
        int32_t index = scriptsIndex[
                numScripts + REORDER_RESERVED_BEFORE_LATIN - UCOL_REORDER_CODE_FIRST];
        if(index != 0) {
            table[index] = 0xff;
        }
        index = scriptsIndex[
                numScripts + REORDER_RESERVED_AFTER_LATIN - UCOL_REORDER_CODE_FIRST];
        if(index != 0) {
            table[index] = 0xff;
        }
    }

    // Never reorder special low and high primary lead bytes.
    U_ASSERT(scriptStartsLength >= 2);
    U_ASSERT(scriptStarts[0] == 0);
    int32_t lowStart = scriptStarts[1];
    U_ASSERT(lowStart == ((Collation::MERGE_SEPARATOR_BYTE + 1) << 8));
    int32_t highLimit = scriptStarts[scriptStartsLength - 1];
    U_ASSERT(highLimit == (Collation::TRAIL_WEIGHT_BYTE << 8));

    // Get the set of special reorder codes in the input list.
    // This supports a fixed number of special reorder codes;
    // it works for data with codes beyond UCOL_REORDER_CODE_LIMIT.
    uint32_t specials = 0;
    for(int32_t i = 0; i < length; ++i) {
        int32_t reorderCode = reorder[i] - UCOL_REORDER_CODE_FIRST;
        if(0 <= reorderCode && reorderCode < MAX_NUM_SPECIAL_REORDER_CODES) {
            specials |= (uint32_t)1 << reorderCode;
        }
    }

    // Start the reordering with the special low reorder codes that do not occur in the input.
    for(int32_t i = 0; i < MAX_NUM_SPECIAL_REORDER_CODES; ++i) {
        int32_t index = scriptsIndex[numScripts + i];
        if(index != 0 && (specials & ((uint32_t)1 << i)) == 0) {
            lowStart = addLowScriptRange(table, index, lowStart);
        }
    }

    // Skip the reserved range before Latin if Latin is the first script,
    // so that we do not move it unnecessarily.
    int32_t skippedReserved = 0;
    if(specials == 0 && reorder[0] == USCRIPT_LATIN && !latinMustMove) {
        int32_t index = scriptsIndex[USCRIPT_LATIN];
        U_ASSERT(index != 0);
        int32_t start = scriptStarts[index];
        U_ASSERT(lowStart <= start);
        skippedReserved = start - lowStart;
        lowStart = start;
    }

    // Reorder according to the input scripts, continuing from the bottom of the primary range.
    int32_t originalLength = length;  // length will be decremented if "others" is in the list.
    UBool hasReorderToEnd = FALSE;
    for(int32_t i = 0; i < length;) {
        int32_t script = reorder[i++];
        if(script == USCRIPT_UNKNOWN) {
            // Put the remaining scripts at the top.
            hasReorderToEnd = TRUE;
            while(i < length) {
                script = reorder[--length];
                if(script == USCRIPT_UNKNOWN ||  // Must occur at most once.
                        script == UCOL_REORDER_CODE_DEFAULT) {
                    errorCode = U_ILLEGAL_ARGUMENT_ERROR;
                    return;
                }
                int32_t index = getScriptIndex(script);
                if(index == 0) { continue; }
                if(table[index] != 0) {  // Duplicate or equivalent script.
                    errorCode = U_ILLEGAL_ARGUMENT_ERROR;
                    return;
                }
                highLimit = addHighScriptRange(table, index, highLimit);
            }
            break;
        }
        if(script == UCOL_REORDER_CODE_DEFAULT) {
            // The default code must be the only one in the list, and that is handled by the caller.
            // Otherwise it must not be used.
            errorCode = U_ILLEGAL_ARGUMENT_ERROR;
            return;
        }
        int32_t index = getScriptIndex(script);
        if(index == 0) { continue; }
        if(table[index] != 0) {  // Duplicate or equivalent script.
            errorCode = U_ILLEGAL_ARGUMENT_ERROR;
            return;
        }
        lowStart = addLowScriptRange(table, index, lowStart);
    }

    // Put all remaining scripts into the middle.
    for(int32_t i = 1; i < scriptStartsLength - 1; ++i) {
        int32_t leadByte = table[i];
        if(leadByte != 0) { continue; }
        int32_t start = scriptStarts[i];
        if(!hasReorderToEnd && start > lowStart) {
            // No need to move this script.
            lowStart = start;
        }
        lowStart = addLowScriptRange(table, i, lowStart);
    }
    if(lowStart > highLimit) {
        if((lowStart - (skippedReserved & 0xff00)) <= highLimit) {
            // Try not skipping the before-Latin reserved range.
            makeReorderRanges(reorder, originalLength, TRUE, ranges, errorCode);
            return;
        }
        // We need more primary lead bytes than available, despite the reserved ranges.
        errorCode = U_BUFFER_OVERFLOW_ERROR;
        return;
    }

    // Turn lead bytes into a list of (limit, offset) pairs.
    // Encode each pair in one list element:
    // Upper 16 bits = limit, lower 16 = signed lead byte offset.
    int32_t offset = 0;
    for(int32_t i = 1;; ++i) {
        int32_t nextOffset = offset;
        while(i < scriptStartsLength - 1) {
            int32_t newLeadByte = table[i];
            if(newLeadByte == 0xff) {
                // "Don't care" lead byte for reserved range, continue with current offset.
            } else {
                nextOffset = newLeadByte - (scriptStarts[i] >> 8);
                if(nextOffset != offset) { break; }
            }
            ++i;
        }
        if(offset != 0 || i < scriptStartsLength - 1) {
            ranges.addElement(((int32_t)scriptStarts[i] << 16) | (offset & 0xffff), errorCode);
        }
        if(i == scriptStartsLength - 1) { break; }
        offset = nextOffset;
    }
}